

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImStb::stb_textedit_key(ImGuiInputTextState *str,STB_TexteditState *state,int key)

{
  bool bVar1;
  ImWchar IVar2;
  int iVar3;
  uint in_EDX;
  STB_TexteditState *in_RSI;
  ImGuiInputTextState *in_RDI;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int n_2;
  int n_1;
  int n;
  float dx_1;
  float goal_x_1;
  float x_1;
  int row_count_1;
  int is_page_1;
  int sel_1;
  int prev_scan;
  int j_1;
  int i_1;
  StbTexteditRow row_1;
  StbFindState find_1;
  float dx;
  int start;
  float goal_x;
  float x;
  int row_count;
  int is_page;
  int sel;
  int j;
  int i;
  StbTexteditRow row;
  StbFindState find;
  ImWchar ch;
  int c;
  int in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  byte in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff11;
  undefined1 in_stack_ffffffffffffff12;
  undefined1 in_stack_ffffffffffffff13;
  int in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  float fVar8;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int local_ac;
  int local_a8;
  int local_a4;
  float local_a0;
  int local_8c;
  float local_88;
  int local_7c;
  int local_74;
  float local_64;
  int local_54;
  int local_50;
  float local_4c;
  int local_38;
  float local_34;
  int local_28;
  int local_24;
  uint local_14;
  
  local_14 = in_EDX;
LAB_0054439e:
  do {
    if (local_14 == 0x200000) {
      if (in_RSI->select_start == in_RSI->select_end) {
        if (0 < in_RSI->cursor) {
          in_RSI->cursor = in_RSI->cursor + -1;
        }
      }
      else {
        stb_textedit_move_to_first((STB_TexteditState *)0x5447c2);
      }
      in_RSI->has_preferred_x = '\0';
      return;
    }
    if (local_14 == 0x200001) {
      if (in_RSI->select_start == in_RSI->select_end) {
        in_RSI->cursor = in_RSI->cursor + 1;
      }
      else {
        stb_textedit_move_to_last
                  ((ImGuiInputTextState *)
                   CONCAT44(in_stack_ffffffffffffff14,
                            CONCAT13(in_stack_ffffffffffffff13,
                                     CONCAT12(in_stack_ffffffffffffff12,
                                              CONCAT11(in_stack_ffffffffffffff11,
                                                       in_stack_ffffffffffffff10)))),
                   (STB_TexteditState *)
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      }
      stb_textedit_clamp((ImGuiInputTextState *)
                         CONCAT44(in_stack_ffffffffffffff14,
                                  CONCAT13(in_stack_ffffffffffffff13,
                                           CONCAT12(in_stack_ffffffffffffff12,
                                                    CONCAT11(in_stack_ffffffffffffff11,
                                                             in_stack_ffffffffffffff10)))),
                         (STB_TexteditState *)
                         CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      in_RSI->has_preferred_x = '\0';
      return;
    }
    if (local_14 == 0x200002) goto LAB_00544e3e;
    if (local_14 == 0x200003) goto LAB_00544ad5;
    if (local_14 == 0x200004) {
      stb_textedit_clamp((ImGuiInputTextState *)
                         CONCAT44(in_stack_ffffffffffffff14,
                                  CONCAT13(in_stack_ffffffffffffff13,
                                           CONCAT12(in_stack_ffffffffffffff12,
                                                    CONCAT11(in_stack_ffffffffffffff11,
                                                             in_stack_ffffffffffffff10)))),
                         (STB_TexteditState *)
                         CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      stb_textedit_move_to_first((STB_TexteditState *)0x5453a2);
      if (in_RSI->single_line == '\0') {
        while( true ) {
          bVar1 = false;
          if (0 < in_RSI->cursor) {
            IVar2 = STB_TEXTEDIT_GETCHAR
                              ((ImGuiInputTextState *)
                               CONCAT44(in_stack_ffffffffffffff14,
                                        CONCAT13(in_stack_ffffffffffffff13,
                                                 (uint3)CONCAT11(in_stack_ffffffffffffff11,
                                                                 in_stack_ffffffffffffff10))),
                               in_stack_ffffffffffffff0c);
            bVar1 = IVar2 != STB_TEXTEDIT_NEWLINE;
          }
          if (!bVar1) break;
          in_RSI->cursor = in_RSI->cursor + -1;
        }
      }
      else {
        in_RSI->cursor = 0;
      }
      in_RSI->has_preferred_x = '\0';
      return;
    }
    if (local_14 == 0x200005) {
      iVar3 = STB_TEXTEDIT_STRINGLEN(in_RDI);
      stb_textedit_clamp((ImGuiInputTextState *)
                         CONCAT44(in_stack_ffffffffffffff14,
                                  CONCAT13(in_stack_ffffffffffffff13,
                                           CONCAT12(in_stack_ffffffffffffff12,
                                                    CONCAT11(in_stack_ffffffffffffff11,
                                                             in_stack_ffffffffffffff10)))),
                         (STB_TexteditState *)
                         CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      stb_textedit_move_to_first((STB_TexteditState *)0x545463);
      if (in_RSI->single_line == '\0') {
        while( true ) {
          bVar1 = false;
          if (in_RSI->cursor < iVar3) {
            IVar2 = STB_TEXTEDIT_GETCHAR
                              ((ImGuiInputTextState *)
                               CONCAT44(in_stack_ffffffffffffff14,
                                        CONCAT13(in_stack_ffffffffffffff13,
                                                 CONCAT12(in_stack_ffffffffffffff12,
                                                          (ushort)in_stack_ffffffffffffff10))),
                               in_stack_ffffffffffffff0c);
            bVar1 = IVar2 != STB_TEXTEDIT_NEWLINE;
          }
          if (!bVar1) break;
          in_RSI->cursor = in_RSI->cursor + 1;
        }
      }
      else {
        in_RSI->cursor = iVar3;
      }
      in_RSI->has_preferred_x = '\0';
      return;
    }
    if (local_14 == 0x200006) {
      in_RSI->select_end = 0;
      in_RSI->select_start = 0;
      in_RSI->cursor = 0;
      in_RSI->has_preferred_x = '\0';
      return;
    }
    if (local_14 == 0x200007) {
      iVar3 = STB_TEXTEDIT_STRINGLEN(in_RDI);
      in_RSI->cursor = iVar3;
      in_RSI->select_end = 0;
      in_RSI->select_start = 0;
      in_RSI->has_preferred_x = '\0';
      return;
    }
    if (local_14 == 0x200008) {
LAB_0054515d:
      if (in_RSI->select_start == in_RSI->select_end) {
        iVar3 = STB_TEXTEDIT_STRINGLEN(in_RDI);
        if (in_RSI->cursor < iVar3) {
          stb_textedit_delete((ImGuiInputTextState *)
                              CONCAT44(in_stack_ffffffffffffff14,
                                       CONCAT13(in_stack_ffffffffffffff13,
                                                CONCAT12(in_stack_ffffffffffffff12,
                                                         CONCAT11(in_stack_ffffffffffffff11,
                                                                  in_stack_ffffffffffffff10)))),
                              (STB_TexteditState *)
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0,
                              0x5451d1);
        }
      }
      else {
        stb_textedit_delete_selection
                  ((ImGuiInputTextState *)
                   CONCAT44(in_stack_ffffffffffffff14,
                            CONCAT13(in_stack_ffffffffffffff13,
                                     CONCAT12(in_stack_ffffffffffffff12,
                                              CONCAT11(in_stack_ffffffffffffff11,
                                                       in_stack_ffffffffffffff10)))),
                   (STB_TexteditState *)
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      }
      in_RSI->has_preferred_x = '\0';
      return;
    }
    if (local_14 == 0x200009) {
LAB_005451e4:
      if (in_RSI->select_start == in_RSI->select_end) {
        stb_textedit_clamp((ImGuiInputTextState *)
                           CONCAT44(in_stack_ffffffffffffff14,
                                    CONCAT13(in_stack_ffffffffffffff13,
                                             CONCAT12(in_stack_ffffffffffffff12,
                                                      CONCAT11(in_stack_ffffffffffffff11,
                                                               in_stack_ffffffffffffff10)))),
                           (STB_TexteditState *)
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        if (0 < in_RSI->cursor) {
          stb_textedit_delete((ImGuiInputTextState *)
                              CONCAT44(in_stack_ffffffffffffff14,
                                       CONCAT13(in_stack_ffffffffffffff13,
                                                CONCAT12(in_stack_ffffffffffffff12,
                                                         CONCAT11(in_stack_ffffffffffffff11,
                                                                  in_stack_ffffffffffffff10)))),
                              (STB_TexteditState *)
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0,
                              0x54525c);
          in_RSI->cursor = in_RSI->cursor + -1;
        }
      }
      else {
        stb_textedit_delete_selection
                  ((ImGuiInputTextState *)
                   CONCAT44(in_stack_ffffffffffffff14,
                            CONCAT13(in_stack_ffffffffffffff13,
                                     CONCAT12(in_stack_ffffffffffffff12,
                                              CONCAT11(in_stack_ffffffffffffff11,
                                                       in_stack_ffffffffffffff10)))),
                   (STB_TexteditState *)
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      }
      in_RSI->has_preferred_x = '\0';
      return;
    }
    if (local_14 == 0x20000a) {
      stb_text_undo((ImGuiInputTextState *)
                    CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    (STB_TexteditState *)CONCAT44(0x20000a,in_stack_ffffffffffffff28));
      in_RSI->has_preferred_x = '\0';
      return;
    }
    if (local_14 == 0x20000b) {
      stb_text_redo((ImGuiInputTextState *)
                    CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    (STB_TexteditState *)CONCAT44(0x20000b,in_stack_ffffffffffffff28));
      in_RSI->has_preferred_x = '\0';
      return;
    }
    if (local_14 == 0x20000c) {
      if (in_RSI->select_start != in_RSI->select_end) {
        stb_textedit_move_to_first((STB_TexteditState *)0x5448e3);
        return;
      }
      iVar3 = STB_TEXTEDIT_MOVEWORDLEFT_IMPL
                        ((ImGuiInputTextState *)
                         CONCAT44(in_stack_ffffffffffffff14,
                                  CONCAT13(in_stack_ffffffffffffff13,
                                           CONCAT12(in_stack_ffffffffffffff12,
                                                    CONCAT11(in_stack_ffffffffffffff11,
                                                             in_stack_ffffffffffffff10)))),
                         in_stack_ffffffffffffff0c);
      in_RSI->cursor = iVar3;
      stb_textedit_clamp((ImGuiInputTextState *)
                         CONCAT44(in_stack_ffffffffffffff14,
                                  CONCAT13(in_stack_ffffffffffffff13,
                                           CONCAT12(in_stack_ffffffffffffff12,
                                                    CONCAT11(in_stack_ffffffffffffff11,
                                                             in_stack_ffffffffffffff10)))),
                         (STB_TexteditState *)
                         CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      return;
    }
    if (local_14 == 0x20000d) {
      if (in_RSI->select_start != in_RSI->select_end) {
        stb_textedit_move_to_last
                  ((ImGuiInputTextState *)
                   CONCAT44(in_stack_ffffffffffffff14,
                            CONCAT13(in_stack_ffffffffffffff13,
                                     CONCAT12(in_stack_ffffffffffffff12,
                                              CONCAT11(in_stack_ffffffffffffff11,
                                                       in_stack_ffffffffffffff10)))),
                   (STB_TexteditState *)
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        return;
      }
      iVar3 = STB_TEXTEDIT_MOVEWORDRIGHT_IMPL
                        ((ImGuiInputTextState *)
                         CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0);
      in_RSI->cursor = iVar3;
      stb_textedit_clamp((ImGuiInputTextState *)
                         CONCAT44(in_stack_ffffffffffffff14,
                                  CONCAT13(in_stack_ffffffffffffff13,
                                           CONCAT12(in_stack_ffffffffffffff12,
                                                    CONCAT11(in_stack_ffffffffffffff11,
                                                             in_stack_ffffffffffffff10)))),
                         (STB_TexteditState *)
                         CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      return;
    }
    if (local_14 != 0x20000e) {
      if (local_14 != 0x20000f) {
        if (local_14 == 0x600000) {
          stb_textedit_clamp((ImGuiInputTextState *)
                             CONCAT44(in_stack_ffffffffffffff14,
                                      CONCAT13(in_stack_ffffffffffffff13,
                                               CONCAT12(in_stack_ffffffffffffff12,
                                                        CONCAT11(in_stack_ffffffffffffff11,
                                                                 in_stack_ffffffffffffff10)))),
                             (STB_TexteditState *)
                             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
          stb_textedit_prep_selection_at_cursor(in_RSI);
          if (0 < in_RSI->select_end) {
            in_RSI->select_end = in_RSI->select_end + -1;
          }
          in_RSI->cursor = in_RSI->select_end;
          in_RSI->has_preferred_x = '\0';
          return;
        }
        if (local_14 == 0x600001) {
          stb_textedit_prep_selection_at_cursor(in_RSI);
          in_RSI->select_end = in_RSI->select_end + 1;
          stb_textedit_clamp((ImGuiInputTextState *)
                             CONCAT44(in_stack_ffffffffffffff14,
                                      CONCAT13(in_stack_ffffffffffffff13,
                                               CONCAT12(in_stack_ffffffffffffff12,
                                                        CONCAT11(in_stack_ffffffffffffff11,
                                                                 in_stack_ffffffffffffff10)))),
                             (STB_TexteditState *)
                             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
          in_RSI->cursor = in_RSI->select_end;
          in_RSI->has_preferred_x = '\0';
          return;
        }
        if (local_14 == 0x600002) goto LAB_00544e3e;
        if (local_14 != 0x600003) {
          if (local_14 == 0x600004) {
            stb_textedit_clamp((ImGuiInputTextState *)
                               CONCAT44(in_stack_ffffffffffffff14,
                                        CONCAT13(in_stack_ffffffffffffff13,
                                                 CONCAT12(in_stack_ffffffffffffff12,
                                                          CONCAT11(in_stack_ffffffffffffff11,
                                                                   in_stack_ffffffffffffff10)))),
                               (STB_TexteditState *)
                               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
            stb_textedit_prep_selection_at_cursor(in_RSI);
            if (in_RSI->single_line == '\0') {
              while( true ) {
                bVar1 = false;
                if (0 < in_RSI->cursor) {
                  IVar2 = STB_TEXTEDIT_GETCHAR
                                    ((ImGuiInputTextState *)
                                     ((ulong)CONCAT43(in_stack_ffffffffffffff14,
                                                      CONCAT12(in_stack_ffffffffffffff13,
                                                               CONCAT11(in_stack_ffffffffffffff12,
                                                                        in_stack_ffffffffffffff11)))
                                     << 8),in_stack_ffffffffffffff0c);
                  bVar1 = IVar2 != STB_TEXTEDIT_NEWLINE;
                }
                if (!bVar1) break;
                in_RSI->cursor = in_RSI->cursor + -1;
              }
            }
            else {
              in_RSI->cursor = 0;
            }
            in_RSI->select_end = in_RSI->cursor;
            in_RSI->has_preferred_x = '\0';
            return;
          }
          if (local_14 == 0x600005) {
            iVar3 = STB_TEXTEDIT_STRINGLEN(in_RDI);
            stb_textedit_clamp((ImGuiInputTextState *)
                               CONCAT44(in_stack_ffffffffffffff14,
                                        CONCAT13(in_stack_ffffffffffffff13,
                                                 CONCAT12(in_stack_ffffffffffffff12,
                                                          CONCAT11(in_stack_ffffffffffffff11,
                                                                   in_stack_ffffffffffffff10)))),
                               (STB_TexteditState *)
                               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
            stb_textedit_prep_selection_at_cursor(in_RSI);
            if (in_RSI->single_line == '\0') {
              while( true ) {
                in_stack_ffffffffffffff0c = in_stack_ffffffffffffff0c & 0xffffff;
                if (in_RSI->cursor < iVar3) {
                  IVar2 = STB_TEXTEDIT_GETCHAR
                                    ((ImGuiInputTextState *)
                                     CONCAT44(in_stack_ffffffffffffff14,
                                              CONCAT13(in_stack_ffffffffffffff13,
                                                       CONCAT12(in_stack_ffffffffffffff12,
                                                                CONCAT11(in_stack_ffffffffffffff11,
                                                                         in_stack_ffffffffffffff10))
                                                      )),in_stack_ffffffffffffff0c);
                  in_stack_ffffffffffffff0c =
                       CONCAT13(IVar2 != STB_TEXTEDIT_NEWLINE,(int3)in_stack_ffffffffffffff0c);
                }
                if ((char)(in_stack_ffffffffffffff0c >> 0x18) == '\0') break;
                in_RSI->cursor = in_RSI->cursor + 1;
              }
            }
            else {
              in_RSI->cursor = iVar3;
            }
            in_RSI->select_end = in_RSI->cursor;
            in_RSI->has_preferred_x = '\0';
            return;
          }
          if (local_14 == 0x600006) {
            stb_textedit_prep_selection_at_cursor(in_RSI);
            in_RSI->select_end = 0;
            in_RSI->cursor = 0;
            in_RSI->has_preferred_x = '\0';
            return;
          }
          if (local_14 == 0x600007) {
            stb_textedit_prep_selection_at_cursor(in_RSI);
            iVar3 = STB_TEXTEDIT_STRINGLEN(in_RDI);
            in_RSI->select_end = iVar3;
            in_RSI->cursor = iVar3;
            in_RSI->has_preferred_x = '\0';
            return;
          }
          if (local_14 == 0x600008) goto LAB_0054515d;
          if (local_14 == 0x600009) goto LAB_005451e4;
          if (local_14 == 0x60000c) {
            if (in_RSI->select_start == in_RSI->select_end) {
              stb_textedit_prep_selection_at_cursor(in_RSI);
            }
            iVar3 = STB_TEXTEDIT_MOVEWORDLEFT_IMPL
                              ((ImGuiInputTextState *)
                               CONCAT44(in_stack_ffffffffffffff14,
                                        CONCAT13(in_stack_ffffffffffffff13,
                                                 CONCAT12(in_stack_ffffffffffffff12,
                                                          CONCAT11(in_stack_ffffffffffffff11,
                                                                   in_stack_ffffffffffffff10)))),
                               in_stack_ffffffffffffff0c);
            in_RSI->cursor = iVar3;
            in_RSI->select_end = in_RSI->cursor;
            stb_textedit_clamp((ImGuiInputTextState *)
                               CONCAT44(in_stack_ffffffffffffff14,
                                        CONCAT13(in_stack_ffffffffffffff13,
                                                 CONCAT12(in_stack_ffffffffffffff12,
                                                          CONCAT11(in_stack_ffffffffffffff11,
                                                                   in_stack_ffffffffffffff10)))),
                               (STB_TexteditState *)
                               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
            return;
          }
          if (local_14 == 0x60000d) {
            if (in_RSI->select_start == in_RSI->select_end) {
              stb_textedit_prep_selection_at_cursor(in_RSI);
            }
            iVar3 = STB_TEXTEDIT_MOVEWORDRIGHT_IMPL
                              ((ImGuiInputTextState *)
                               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0);
            in_RSI->cursor = iVar3;
            in_RSI->select_end = in_RSI->cursor;
            stb_textedit_clamp((ImGuiInputTextState *)
                               CONCAT44(in_stack_ffffffffffffff14,
                                        CONCAT13(in_stack_ffffffffffffff13,
                                                 CONCAT12(in_stack_ffffffffffffff12,
                                                          CONCAT11(in_stack_ffffffffffffff11,
                                                                   in_stack_ffffffffffffff10)))),
                               (STB_TexteditState *)
                               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
            return;
          }
          if (local_14 == 0x60000e) goto LAB_00544e3e;
          if (local_14 != 0x60000f) {
            iVar3 = STB_TEXTEDIT_KEYTOTEXT(local_14);
            if (iVar3 < 1) {
              return;
            }
            if ((iVar3 == 10) && (in_RSI->single_line != '\0')) {
              return;
            }
            if ((in_RSI->insert_mode != '\0') && (in_RSI->select_start == in_RSI->select_end)) {
              in_stack_ffffffffffffff28 = in_RSI->cursor;
              iVar3 = STB_TEXTEDIT_STRINGLEN(in_RDI);
              if (in_stack_ffffffffffffff28 < iVar3) {
                stb_text_makeundo_replace
                          ((ImGuiInputTextState *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           (STB_TexteditState *)
                           CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                           in_stack_ffffffffffffff14,
                           CONCAT13(in_stack_ffffffffffffff13,
                                    CONCAT12(in_stack_ffffffffffffff12,
                                             CONCAT11(in_stack_ffffffffffffff11,
                                                      in_stack_ffffffffffffff10))),
                           in_stack_ffffffffffffff0c);
                STB_TEXTEDIT_DELETECHARS
                          ((ImGuiInputTextState *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
                bVar1 = STB_TEXTEDIT_INSERTCHARS
                                  ((ImGuiInputTextState *)
                                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                   in_stack_ffffffffffffff34,
                                   (ImWchar *)CONCAT44(local_14,in_stack_ffffffffffffff28),
                                   in_stack_ffffffffffffff24);
                if (!bVar1) {
                  return;
                }
                in_RSI->cursor = in_RSI->cursor + 1;
                in_RSI->has_preferred_x = '\0';
                return;
              }
            }
            stb_textedit_delete_selection
                      ((ImGuiInputTextState *)
                       CONCAT44(in_stack_ffffffffffffff14,
                                CONCAT13(in_stack_ffffffffffffff13,
                                         CONCAT12(in_stack_ffffffffffffff12,
                                                  CONCAT11(in_stack_ffffffffffffff11,
                                                           in_stack_ffffffffffffff10)))),
                       (STB_TexteditState *)
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
            bVar1 = STB_TEXTEDIT_INSERTCHARS
                              ((ImGuiInputTextState *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               in_stack_ffffffffffffff34,
                               (ImWchar *)CONCAT44(local_14,in_stack_ffffffffffffff28),
                               in_stack_ffffffffffffff24);
            if (!bVar1) {
              return;
            }
            stb_text_makeundo_insert
                      ((STB_TexteditState *)
                       CONCAT44(in_stack_ffffffffffffff14,
                                CONCAT13(in_stack_ffffffffffffff13,
                                         CONCAT12(in_stack_ffffffffffffff12,
                                                  CONCAT11(in_stack_ffffffffffffff11,
                                                           in_stack_ffffffffffffff10)))),
                       in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
            in_RSI->cursor = in_RSI->cursor + 1;
            in_RSI->has_preferred_x = '\0';
            return;
          }
        }
      }
LAB_00544ad5:
      bVar1 = (local_14 & 0x400000) != 0;
      if ((local_14 & 0xffbfffff) == 0x20000f) {
        in_stack_ffffffffffffff24 = in_RSI->row_count_per_page;
      }
      else {
        in_stack_ffffffffffffff24 = 1;
        if (in_RSI->single_line != '\0') {
          local_14 = local_14 & 0x400000 | 0x200001;
          goto LAB_0054439e;
        }
      }
      iVar3 = in_stack_ffffffffffffff24;
      if (bVar1) {
        stb_textedit_prep_selection_at_cursor(in_RSI);
      }
      else if (in_RSI->select_start != in_RSI->select_end) {
        stb_textedit_move_to_last
                  ((ImGuiInputTextState *)
                   CONCAT44(in_stack_ffffffffffffff14,
                            CONCAT13(in_stack_ffffffffffffff13,
                                     CONCAT12(in_stack_ffffffffffffff12,
                                              CONCAT11(in_stack_ffffffffffffff11,
                                                       in_stack_ffffffffffffff10)))),
                   (STB_TexteditState *)
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      }
      stb_textedit_clamp((ImGuiInputTextState *)
                         CONCAT44(in_stack_ffffffffffffff14,
                                  CONCAT13(in_stack_ffffffffffffff13,
                                           CONCAT12(in_stack_ffffffffffffff12,
                                                    CONCAT11(in_stack_ffffffffffffff11,
                                                             in_stack_ffffffffffffff10)))),
                         (STB_TexteditState *)
                         CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      stb_textedit_find_charpos
                ((StbFindState *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (ImGuiInputTextState *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
      local_54 = 0;
      do {
        if (in_stack_ffffffffffffff24 <= local_54) {
          return;
        }
        fVar8 = local_34;
        if (in_RSI->has_preferred_x != '\0') {
          fVar8 = in_RSI->preferred_x;
        }
        if (local_24 == 0) {
          return;
        }
        IVar2 = STB_TEXTEDIT_GETCHAR
                          ((ImGuiInputTextState *)
                           CONCAT44(in_stack_ffffffffffffff14,
                                    CONCAT13(in_stack_ffffffffffffff13,
                                             CONCAT12(in_stack_ffffffffffffff12,
                                                      CONCAT11(in_stack_ffffffffffffff11,
                                                               in_stack_ffffffffffffff10)))),
                           in_stack_ffffffffffffff0c);
        if (IVar2 != STB_TEXTEDIT_NEWLINE) {
          return;
        }
        in_RSI->cursor = local_28 + local_24;
        STB_TEXTEDIT_LAYOUTROW
                  ((StbTexteditRow *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (ImGuiInputTextState *)CONCAT44(local_14,in_stack_ffffffffffffff28),iVar3);
        local_64 = local_4c;
        for (local_50 = 0; local_50 < local_38; local_50 = local_50 + 1) {
          fVar5 = STB_TEXTEDIT_GETWIDTH
                            ((ImGuiInputTextState *)
                             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                             in_stack_ffffffffffffff14,
                             CONCAT13(in_stack_ffffffffffffff13,
                                      CONCAT12(in_stack_ffffffffffffff12,
                                               CONCAT11(in_stack_ffffffffffffff11,
                                                        in_stack_ffffffffffffff10))));
          if (((fVar5 == -1.0) && (!NAN(fVar5))) || (local_64 = fVar5 + local_64, fVar8 < local_64))
          break;
          in_RSI->cursor = in_RSI->cursor + 1;
        }
        stb_textedit_clamp((ImGuiInputTextState *)
                           CONCAT44(in_stack_ffffffffffffff14,
                                    CONCAT13(in_stack_ffffffffffffff13,
                                             CONCAT12(in_stack_ffffffffffffff12,
                                                      CONCAT11(in_stack_ffffffffffffff11,
                                                               in_stack_ffffffffffffff10)))),
                           (STB_TexteditState *)
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        in_RSI->has_preferred_x = '\x01';
        in_RSI->preferred_x = fVar8;
        if (bVar1) {
          in_RSI->select_end = in_RSI->cursor;
        }
        local_28 = local_28 + local_24;
        local_24 = local_38;
        local_54 = local_54 + 1;
      } while( true );
    }
LAB_00544e3e:
    bVar1 = (local_14 & 0x400000) != 0;
    if ((local_14 & 0xffbfffff) == 0x20000e) {
      in_stack_ffffffffffffff1c = in_RSI->row_count_per_page;
LAB_00544ed3:
      iVar3 = in_stack_ffffffffffffff1c;
      if (bVar1) {
        stb_textedit_prep_selection_at_cursor(in_RSI);
      }
      else if (in_RSI->select_start != in_RSI->select_end) {
        stb_textedit_move_to_first((STB_TexteditState *)0x544f0e);
      }
      stb_textedit_clamp((ImGuiInputTextState *)
                         CONCAT44(in_stack_ffffffffffffff14,
                                  CONCAT13(in_stack_ffffffffffffff13,
                                           CONCAT12(in_stack_ffffffffffffff12,
                                                    CONCAT11(in_stack_ffffffffffffff11,
                                                             in_stack_ffffffffffffff10)))),
                         (STB_TexteditState *)
                         CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      stb_textedit_find_charpos
                ((StbFindState *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (ImGuiInputTextState *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
      local_a8 = 0;
      do {
        if (in_stack_ffffffffffffff1c <= local_a8) {
          return;
        }
        fVar8 = local_88;
        if (in_RSI->has_preferred_x != '\0') {
          fVar8 = in_RSI->preferred_x;
        }
        if (local_74 == local_7c) {
          return;
        }
        in_RSI->cursor = local_74;
        fVar5 = fVar8;
        STB_TEXTEDIT_LAYOUTROW
                  ((StbTexteditRow *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (ImGuiInputTextState *)CONCAT44(local_14,in_stack_ffffffffffffff28),
                   in_stack_ffffffffffffff24);
        fVar7 = local_a0;
        for (local_a4 = 0; local_a4 < local_8c; local_a4 = local_a4 + 1) {
          fVar6 = STB_TEXTEDIT_GETWIDTH
                            ((ImGuiInputTextState *)CONCAT44(iVar3,fVar8),in_stack_ffffffffffffff14,
                             CONCAT13(in_stack_ffffffffffffff13,
                                      CONCAT12(in_stack_ffffffffffffff12,
                                               CONCAT11(in_stack_ffffffffffffff11,
                                                        in_stack_ffffffffffffff10))));
          if (((fVar6 == -1.0) && (!NAN(fVar6))) || (fVar7 = fVar6 + fVar7, fVar5 < fVar7)) break;
          in_RSI->cursor = in_RSI->cursor + 1;
        }
        stb_textedit_clamp((ImGuiInputTextState *)
                           CONCAT44(in_stack_ffffffffffffff14,
                                    CONCAT13(in_stack_ffffffffffffff13,
                                             CONCAT12(in_stack_ffffffffffffff12,
                                                      CONCAT11(in_stack_ffffffffffffff11,
                                                               in_stack_ffffffffffffff10)))),
                           (STB_TexteditState *)
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        in_RSI->has_preferred_x = '\x01';
        in_RSI->preferred_x = fVar5;
        if (bVar1) {
          in_RSI->select_end = in_RSI->cursor;
        }
        if (local_74 < 1) {
          in_stack_ffffffffffffff14 = 0;
          local_ac = in_stack_ffffffffffffff14;
        }
        else {
          in_stack_ffffffffffffff14 = local_74 + -1;
          local_ac = in_stack_ffffffffffffff14;
        }
        while( true ) {
          bVar4 = false;
          if (0 < local_ac) {
            IVar2 = STB_TEXTEDIT_GETCHAR
                              ((ImGuiInputTextState *)
                               CONCAT44(in_stack_ffffffffffffff14,
                                        (uint)CONCAT12(in_stack_ffffffffffffff12,
                                                       CONCAT11(in_stack_ffffffffffffff11,
                                                                in_stack_ffffffffffffff10))),
                               in_stack_ffffffffffffff0c);
            bVar4 = IVar2 != STB_TEXTEDIT_NEWLINE;
          }
          if (!bVar4) break;
          local_ac = local_ac + -1;
        }
        local_7c = local_74;
        local_74 = local_ac;
        local_a8 = local_a8 + 1;
        in_stack_ffffffffffffff13 = 0;
      } while( true );
    }
    in_stack_ffffffffffffff1c = 1;
    if (in_RSI->single_line == '\0') goto LAB_00544ed3;
    local_14 = local_14 & 0x400000 | 0x200000;
  } while( true );
}

Assistant:

static void stb_textedit_key(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, STB_TEXTEDIT_KEYTYPE key)
{
retry:
   switch (key) {
      default: {
         int c = STB_TEXTEDIT_KEYTOTEXT(key);
         if (c > 0) {
            STB_TEXTEDIT_CHARTYPE ch = (STB_TEXTEDIT_CHARTYPE) c;

            // can't add newline in single-line mode
            if (c == '\n' && state->single_line)
               break;

            if (state->insert_mode && !STB_TEXT_HAS_SELECTION(state) && state->cursor < STB_TEXTEDIT_STRINGLEN(str)) {
               stb_text_makeundo_replace(str, state, state->cursor, 1, 1);
               STB_TEXTEDIT_DELETECHARS(str, state->cursor, 1);
               if (STB_TEXTEDIT_INSERTCHARS(str, state->cursor, &ch, 1)) {
                  ++state->cursor;
                  state->has_preferred_x = 0;
               }
            } else {
               stb_textedit_delete_selection(str,state); // implicitly clamps
               if (STB_TEXTEDIT_INSERTCHARS(str, state->cursor, &ch, 1)) {
                  stb_text_makeundo_insert(state, state->cursor, 1);
                  ++state->cursor;
                  state->has_preferred_x = 0;
               }
            }
         }
         break;
      }

#ifdef STB_TEXTEDIT_K_INSERT
      case STB_TEXTEDIT_K_INSERT:
         state->insert_mode = !state->insert_mode;
         break;
#endif

      case STB_TEXTEDIT_K_UNDO:
         stb_text_undo(str, state);
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_REDO:
         stb_text_redo(str, state);
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_LEFT:
         // if currently there's a selection, move cursor to start of selection
         if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_move_to_first(state);
         else
            if (state->cursor > 0)
               --state->cursor;
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_RIGHT:
         // if currently there's a selection, move cursor to end of selection
         if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_move_to_last(str, state);
         else
            ++state->cursor;
         stb_textedit_clamp(str, state);
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_LEFT | STB_TEXTEDIT_K_SHIFT:
         stb_textedit_clamp(str, state);
         stb_textedit_prep_selection_at_cursor(state);
         // move selection left
         if (state->select_end > 0)
            --state->select_end;
         state->cursor = state->select_end;
         state->has_preferred_x = 0;
         break;

#ifdef STB_TEXTEDIT_MOVEWORDLEFT
      case STB_TEXTEDIT_K_WORDLEFT:
         if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_move_to_first(state);
         else {
            state->cursor = STB_TEXTEDIT_MOVEWORDLEFT(str, state->cursor);
            stb_textedit_clamp( str, state );
         }
         break;

      case STB_TEXTEDIT_K_WORDLEFT | STB_TEXTEDIT_K_SHIFT:
         if( !STB_TEXT_HAS_SELECTION( state ) )
            stb_textedit_prep_selection_at_cursor(state);

         state->cursor = STB_TEXTEDIT_MOVEWORDLEFT(str, state->cursor);
         state->select_end = state->cursor;

         stb_textedit_clamp( str, state );
         break;
#endif

#ifdef STB_TEXTEDIT_MOVEWORDRIGHT
      case STB_TEXTEDIT_K_WORDRIGHT:
         if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_move_to_last(str, state);
         else {
            state->cursor = STB_TEXTEDIT_MOVEWORDRIGHT(str, state->cursor);
            stb_textedit_clamp( str, state );
         }
         break;

      case STB_TEXTEDIT_K_WORDRIGHT | STB_TEXTEDIT_K_SHIFT:
         if( !STB_TEXT_HAS_SELECTION( state ) )
            stb_textedit_prep_selection_at_cursor(state);

         state->cursor = STB_TEXTEDIT_MOVEWORDRIGHT(str, state->cursor);
         state->select_end = state->cursor;

         stb_textedit_clamp( str, state );
         break;
#endif

      case STB_TEXTEDIT_K_RIGHT | STB_TEXTEDIT_K_SHIFT:
         stb_textedit_prep_selection_at_cursor(state);
         // move selection right
         ++state->select_end;
         stb_textedit_clamp(str, state);
         state->cursor = state->select_end;
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_DOWN:
      case STB_TEXTEDIT_K_DOWN | STB_TEXTEDIT_K_SHIFT:
      case STB_TEXTEDIT_K_PGDOWN:
      case STB_TEXTEDIT_K_PGDOWN | STB_TEXTEDIT_K_SHIFT: {
         StbFindState find;
         StbTexteditRow row;
         int i, j, sel = (key & STB_TEXTEDIT_K_SHIFT) != 0;
         int is_page = (key & ~STB_TEXTEDIT_K_SHIFT) == STB_TEXTEDIT_K_PGDOWN;
         int row_count = is_page ? state->row_count_per_page : 1;

         if (!is_page && state->single_line) {
            // on windows, up&down in single-line behave like left&right
            key = STB_TEXTEDIT_K_RIGHT | (key & STB_TEXTEDIT_K_SHIFT);
            goto retry;
         }

         if (sel)
            stb_textedit_prep_selection_at_cursor(state);
         else if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_move_to_last(str, state);

         // compute current position of cursor point
         stb_textedit_clamp(str, state);
         stb_textedit_find_charpos(&find, str, state->cursor, state->single_line);

         for (j = 0; j < row_count; ++j) {
            float x, goal_x = state->has_preferred_x ? state->preferred_x : find.x;
            int start = find.first_char + find.length;

            if (find.length == 0)
               break;

            // [DEAR IMGUI]
            // going down while being on the last line shouldn't bring us to that line end
            if (STB_TEXTEDIT_GETCHAR(str, find.first_char + find.length - 1) != STB_TEXTEDIT_NEWLINE)
               break;

            // now find character position down a row
            state->cursor = start;
            STB_TEXTEDIT_LAYOUTROW(&row, str, state->cursor);
            x = row.x0;
            for (i=0; i < row.num_chars; ++i) {
               float dx = STB_TEXTEDIT_GETWIDTH(str, start, i);
               #ifdef STB_TEXTEDIT_GETWIDTH_NEWLINE
               if (dx == STB_TEXTEDIT_GETWIDTH_NEWLINE)
                  break;
               #endif
               x += dx;
               if (x > goal_x)
                  break;
               ++state->cursor;
            }
            stb_textedit_clamp(str, state);

            state->has_preferred_x = 1;
            state->preferred_x = goal_x;

            if (sel)
               state->select_end = state->cursor;

            // go to next line
            find.first_char = find.first_char + find.length;
            find.length = row.num_chars;
         }
         break;
      }

      case STB_TEXTEDIT_K_UP:
      case STB_TEXTEDIT_K_UP | STB_TEXTEDIT_K_SHIFT:
      case STB_TEXTEDIT_K_PGUP:
      case STB_TEXTEDIT_K_PGUP | STB_TEXTEDIT_K_SHIFT: {
         StbFindState find;
         StbTexteditRow row;
         int i, j, prev_scan, sel = (key & STB_TEXTEDIT_K_SHIFT) != 0;
         int is_page = (key & ~STB_TEXTEDIT_K_SHIFT) == STB_TEXTEDIT_K_PGUP;
         int row_count = is_page ? state->row_count_per_page : 1;

         if (!is_page && state->single_line) {
            // on windows, up&down become left&right
            key = STB_TEXTEDIT_K_LEFT | (key & STB_TEXTEDIT_K_SHIFT);
            goto retry;
         }

         if (sel)
            stb_textedit_prep_selection_at_cursor(state);
         else if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_move_to_first(state);

         // compute current position of cursor point
         stb_textedit_clamp(str, state);
         stb_textedit_find_charpos(&find, str, state->cursor, state->single_line);

         for (j = 0; j < row_count; ++j) {
            float  x, goal_x = state->has_preferred_x ? state->preferred_x : find.x;

            // can only go up if there's a previous row
            if (find.prev_first == find.first_char)
               break;

            // now find character position up a row
            state->cursor = find.prev_first;
            STB_TEXTEDIT_LAYOUTROW(&row, str, state->cursor);
            x = row.x0;
            for (i=0; i < row.num_chars; ++i) {
               float dx = STB_TEXTEDIT_GETWIDTH(str, find.prev_first, i);
               #ifdef STB_TEXTEDIT_GETWIDTH_NEWLINE
               if (dx == STB_TEXTEDIT_GETWIDTH_NEWLINE)
                  break;
               #endif
               x += dx;
               if (x > goal_x)
                  break;
               ++state->cursor;
            }
            stb_textedit_clamp(str, state);

            state->has_preferred_x = 1;
            state->preferred_x = goal_x;

            if (sel)
               state->select_end = state->cursor;

            // go to previous line
            // (we need to scan previous line the hard way. maybe we could expose this as a new API function?)
            prev_scan = find.prev_first > 0 ? find.prev_first - 1 : 0;
            while (prev_scan > 0 && STB_TEXTEDIT_GETCHAR(str, prev_scan - 1) != STB_TEXTEDIT_NEWLINE)
               --prev_scan;
            find.first_char = find.prev_first;
            find.prev_first = prev_scan;
         }
         break;
      }

      case STB_TEXTEDIT_K_DELETE:
      case STB_TEXTEDIT_K_DELETE | STB_TEXTEDIT_K_SHIFT:
         if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_delete_selection(str, state);
         else {
            int n = STB_TEXTEDIT_STRINGLEN(str);
            if (state->cursor < n)
               stb_textedit_delete(str, state, state->cursor, 1);
         }
         state->has_preferred_x = 0;
         break;

      case STB_TEXTEDIT_K_BACKSPACE:
      case STB_TEXTEDIT_K_BACKSPACE | STB_TEXTEDIT_K_SHIFT:
         if (STB_TEXT_HAS_SELECTION(state))
            stb_textedit_delete_selection(str, state);
         else {
            stb_textedit_clamp(str, state);
            if (state->cursor > 0) {
               stb_textedit_delete(str, state, state->cursor-1, 1);
               --state->cursor;
            }
         }
         state->has_preferred_x = 0;
         break;

#ifdef STB_TEXTEDIT_K_TEXTSTART2
      case STB_TEXTEDIT_K_TEXTSTART2:
#endif
      case STB_TEXTEDIT_K_TEXTSTART:
         state->cursor = state->select_start = state->select_end = 0;
         state->has_preferred_x = 0;
         break;

#ifdef STB_TEXTEDIT_K_TEXTEND2
      case STB_TEXTEDIT_K_TEXTEND2:
#endif
      case STB_TEXTEDIT_K_TEXTEND:
         state->cursor = STB_TEXTEDIT_STRINGLEN(str);
         state->select_start = state->select_end = 0;
         state->has_preferred_x = 0;
         break;

#ifdef STB_TEXTEDIT_K_TEXTSTART2
      case STB_TEXTEDIT_K_TEXTSTART2 | STB_TEXTEDIT_K_SHIFT:
#endif
      case STB_TEXTEDIT_K_TEXTSTART | STB_TEXTEDIT_K_SHIFT:
         stb_textedit_prep_selection_at_cursor(state);
         state->cursor = state->select_end = 0;
         state->has_preferred_x = 0;
         break;

#ifdef STB_TEXTEDIT_K_TEXTEND2
      case STB_TEXTEDIT_K_TEXTEND2 | STB_TEXTEDIT_K_SHIFT:
#endif
      case STB_TEXTEDIT_K_TEXTEND | STB_TEXTEDIT_K_SHIFT:
         stb_textedit_prep_selection_at_cursor(state);
         state->cursor = state->select_end = STB_TEXTEDIT_STRINGLEN(str);
         state->has_preferred_x = 0;
         break;


#ifdef STB_TEXTEDIT_K_LINESTART2
      case STB_TEXTEDIT_K_LINESTART2:
#endif
      case STB_TEXTEDIT_K_LINESTART:
         stb_textedit_clamp(str, state);
         stb_textedit_move_to_first(state);
         if (state->single_line)
            state->cursor = 0;
         else while (state->cursor > 0 && STB_TEXTEDIT_GETCHAR(str, state->cursor-1) != STB_TEXTEDIT_NEWLINE)
            --state->cursor;
         state->has_preferred_x = 0;
         break;

#ifdef STB_TEXTEDIT_K_LINEEND2
      case STB_TEXTEDIT_K_LINEEND2:
#endif
      case STB_TEXTEDIT_K_LINEEND: {
         int n = STB_TEXTEDIT_STRINGLEN(str);
         stb_textedit_clamp(str, state);
         stb_textedit_move_to_first(state);
         if (state->single_line)
             state->cursor = n;
         else while (state->cursor < n && STB_TEXTEDIT_GETCHAR(str, state->cursor) != STB_TEXTEDIT_NEWLINE)
             ++state->cursor;
         state->has_preferred_x = 0;
         break;
      }

#ifdef STB_TEXTEDIT_K_LINESTART2
      case STB_TEXTEDIT_K_LINESTART2 | STB_TEXTEDIT_K_SHIFT:
#endif
      case STB_TEXTEDIT_K_LINESTART | STB_TEXTEDIT_K_SHIFT:
         stb_textedit_clamp(str, state);
         stb_textedit_prep_selection_at_cursor(state);
         if (state->single_line)
            state->cursor = 0;
         else while (state->cursor > 0 && STB_TEXTEDIT_GETCHAR(str, state->cursor-1) != STB_TEXTEDIT_NEWLINE)
            --state->cursor;
         state->select_end = state->cursor;
         state->has_preferred_x = 0;
         break;

#ifdef STB_TEXTEDIT_K_LINEEND2
      case STB_TEXTEDIT_K_LINEEND2 | STB_TEXTEDIT_K_SHIFT:
#endif
      case STB_TEXTEDIT_K_LINEEND | STB_TEXTEDIT_K_SHIFT: {
         int n = STB_TEXTEDIT_STRINGLEN(str);
         stb_textedit_clamp(str, state);
         stb_textedit_prep_selection_at_cursor(state);
         if (state->single_line)
             state->cursor = n;
         else while (state->cursor < n && STB_TEXTEDIT_GETCHAR(str, state->cursor) != STB_TEXTEDIT_NEWLINE)
            ++state->cursor;
         state->select_end = state->cursor;
         state->has_preferred_x = 0;
         break;
      }
   }
}